

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O1

void test_1(string *out_dir)

{
  pointer pcVar1;
  Index IVar2;
  variable_if_dynamic<long,__1> vVar3;
  ChStreamOutAscii *pCVar4;
  ulong uVar5;
  Index *pIVar6;
  char *pcVar7;
  Index index;
  ulong uVar8;
  Index *pIVar9;
  long lVar10;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar11;
  ActualDstType actualDst;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  string filename;
  double max_LCPerr;
  double max_res;
  ChSystemDescriptor mdescriptor;
  ChVariablesGeneric mvarA;
  Matrix<double,__1,__1,_1,__1,__1> local_948;
  Matrix<double,__1,__1,_1,__1,__1> local_930;
  ChVariablesGeneric mvarB;
  Matrix<double,__1,__1,_1,__1,__1> local_8d8;
  Matrix<double,__1,__1,_1,__1,__1> local_8c0;
  ChSparseMatrix matrCq;
  ChSparseMatrix matrM;
  ChConstraintTwoGeneric mcb;
  double local_7f8;
  double local_7f0;
  ChConstraintTwoGeneric mca;
  double local_760;
  double local_758;
  ChStreamOutAsciiFile fileM;
  long local_6c0;
  ChStreamOutAscii local_400 [32];
  ChSolverPSOR solver;
  ChStreamOutAsciiFile fileCq;
  long local_310 [88];
  ChStreamOutAscii local_50 [32];
  
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar4,"\n-------------------------------------------------\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"TEST: generic system with two constraints \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor(&mdescriptor);
  chrono::ChVariablesGeneric::ChVariablesGeneric(&mvarA,3);
  IVar2 = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols;
  _fileM = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if ((local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols |
      local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows) <
      0) {
LAB_0010f42d:
    pcVar7 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
    ;
    goto LAB_0010f4cc;
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (&local_948,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)&fileM,(assign_op<double,_double> *)&fileCq);
  if (-1 < (local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols | local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows)) {
    uVar5 = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols * local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
    uVar8 = uVar5 + 7;
    if (-1 < (long)uVar5) {
      uVar8 = uVar5;
    }
    uVar8 = uVar8 & 0xfffffffffffffff8;
    if (7 < (long)uVar5) {
      lVar10 = 0;
      auVar12 = vbroadcastsd_avx512f(ZEXT816(0x4024000000000000));
      do {
        auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])
                                          (local_948.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                           .m_storage.m_data + lVar10));
        *(undefined1 (*) [64])
         (local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data + lVar10) = auVar13;
        lVar10 = lVar10 + 8;
      } while (lVar10 < (long)uVar8);
    }
    if ((long)uVar8 < (long)uVar5) {
      do {
        local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        [uVar8] = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data[uVar8] * 10.0;
        uVar8 = uVar8 + 1;
      } while (uVar5 - uVar8 != 0);
    }
    if (local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        != local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols) {
LAB_0010f45e:
      __assert_fail("rows() == cols()","/usr/include/eigen3/Eigen/src/LU/InverseImpl.h",0x15f,
                    "const Inverse<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1, 1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    _fileM = (long)&local_948;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_930,(SrcXprType *)&fileM,(assign_op<double,_double> *)&fileCq);
    chrono::ChVariables::Get_fb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
    if (0 < IVar2) {
      *(undefined8 *)_fileM = 0x3ff0000000000000;
      chrono::ChVariables::Get_fb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
      if (1 < IVar2) {
        *(Index *)(_fileM + 8) = 0x4000000000000000;
        chrono::ChVariablesGeneric::ChVariablesGeneric(&mvarB,3);
        IVar2 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_cols;
        _fileM = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        if ((local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_cols | local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_rows) < 0) goto LAB_0010f42d;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                  (&local_8d8,
                   (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    *)&fileM,(assign_op<double,_double> *)&fileCq);
        if (-1 < (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols |
                 local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows)) {
          uVar5 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols *
                  local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_rows;
          uVar8 = uVar5 + 7;
          if (-1 < (long)uVar5) {
            uVar8 = uVar5;
          }
          uVar8 = uVar8 & 0xfffffffffffffff8;
          if (7 < (long)uVar5) {
            lVar10 = 0;
            auVar12 = vbroadcastsd_avx512f(ZEXT816(0x4034000000000000));
            do {
              auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])
                                                (local_8d8.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 .m_storage.m_data + lVar10));
              *(undefined1 (*) [64])
               (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_data + lVar10) = auVar13;
              lVar10 = lVar10 + 8;
            } while (lVar10 < (long)uVar8);
          }
          if ((long)uVar8 < (long)uVar5) {
            do {
              local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data[uVar8] =
                   local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data[uVar8] * 20.0;
              uVar8 = uVar8 + 1;
            } while (uVar5 - uVar8 != 0);
          }
          if (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_rows != local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                        m_storage.m_cols) goto LAB_0010f45e;
          _fileM = (long)&local_8d8;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run(&local_8c0,(SrcXprType *)&fileM,(assign_op<double,_double> *)&fileCq);
          chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarA);
          chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarB);
          chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
                    (&mca,(ChVariables *)&mvarA,(ChVariables *)&mvarB);
          chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
          if (0 < local_6c0) {
            *(undefined8 *)_fileM = 0x3ff0000000000000;
            chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
            if (1 < local_6c0) {
              *(Index *)(_fileM + 8) = 0x4000000000000000;
              chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
              if (2 < local_6c0) {
                *(Index *)(_fileM + 0x10) = -0x4010000000000000;
                chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
                if (0 < local_6c0) {
                  *(undefined8 *)_fileM = 0x3ff0000000000000;
                  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
                  if (1 < local_6c0) {
                    *(Index *)(_fileM + 8) = -0x4000000000000000;
                    chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
                    if (2 < local_6c0) {
                      *(Index *)(_fileM + 0x10) = 0;
                      chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
                                (&mcb,(ChVariables *)&mvarA,(ChVariables *)&mvarB);
                      chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
                      if (0 < local_6c0) {
                        *(undefined8 *)_fileM = 0;
                        chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
                        if (1 < local_6c0) {
                          *(Index *)(_fileM + 8) = 0x3ff0000000000000;
                          chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
                          if (2 < local_6c0) {
                            *(Index *)(_fileM + 0x10) = 0;
                            chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mcb);
                            if (0 < local_6c0) {
                              *(undefined8 *)_fileM = 0;
                              chrono::ChConstraintTwoGeneric::Get_Cq_b
                                        ((ChRowVectorRef *)&fileM,&mcb);
                              if (1 < local_6c0) {
                                *(Index *)(_fileM + 8) = -0x4000000000000000;
                                chrono::ChConstraintTwoGeneric::Get_Cq_b
                                          ((ChRowVectorRef *)&fileM,&mcb);
                                if (2 < local_6c0) {
                                  *(Index *)(_fileM + 0x10) = 0;
                                  chrono::ChSystemDescriptor::InsertConstraint
                                            (&mdescriptor,(ChConstraint *)&mca);
                                  chrono::ChSystemDescriptor::InsertConstraint
                                            (&mdescriptor,(ChConstraint *)&mcb);
                                  (**(code **)(_mdescriptor + 0x48))();
                                  chrono::ChSolverPSOR::ChSolverPSOR(&solver);
                                  chrono::ChIterativeSolverVI::SetOmega(0.8);
                                  chrono::ChSolverPSOR::Solve((ChSystemDescriptor *)&solver);
                                  chrono::ChSystemDescriptor::ComputeFeasabilityViolation
                                            ((double *)&mdescriptor,&max_res);
                                  matrM.
                                  super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  m_isRValue = (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>
                                                )false;
                                  matrM._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_001355e8;
                                  matrM.m_outerSize = -1;
                                  matrM.m_innerSize = 0;
                                  matrM.m_outerIndex = (StorageIndex *)0x0;
                                  matrM.m_innerNonZeros = (StorageIndex *)0x0;
                                  matrM.m_data.m_values = (Scalar *)0x0;
                                  matrM.m_data.m_indices = (StorageIndex *)0x0;
                                  matrM.m_data.m_size = 0;
                                  matrM.m_data.m_allocatedSize = 0;
                                  Eigen::SparseMatrix<double,_1,_int>::resize(&matrM,0,0);
                                  matrCq.
                                  super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  m_isRValue = (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>
                                                )false;
                                  matrCq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_001355e8
                                  ;
                                  matrCq.m_outerSize = -1;
                                  matrCq.m_innerSize = 0;
                                  matrCq.m_outerIndex = (StorageIndex *)0x0;
                                  matrCq.m_innerNonZeros = (StorageIndex *)0x0;
                                  matrCq.m_data.m_values = (Scalar *)0x0;
                                  matrCq.m_data.m_indices = (StorageIndex *)0x0;
                                  matrCq.m_data.m_size = 0;
                                  matrCq.m_data.m_allocatedSize = 0;
                                  Eigen::SparseMatrix<double,_1,_int>::resize(&matrCq,0,0);
                                  chrono::ChSystemDescriptor::ConvertToMatrixForm
                                            ((SparseMatrix *)&mdescriptor,(SparseMatrix *)&matrCq,
                                             (SparseMatrix *)&matrM,(Matrix *)0x0,(Matrix *)0x0,
                                             (Matrix *)0x0,false,false);
                                  pcVar1 = (out_dir->_M_dataplus)._M_p;
                                  filename._M_dataplus._M_p = (pointer)&filename.field_2;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&filename,pcVar1,
                                             pcVar1 + out_dir->_M_string_length);
                                  std::__cxx11::string::append((char *)&filename);
                                  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
                                            (&fileM,filename._M_dataplus._M_p,_S_trunc);
                                  pcVar1 = (out_dir->_M_dataplus)._M_p;
                                  _fileCq = local_310;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&fileCq,pcVar1,
                                             pcVar1 + out_dir->_M_string_length);
                                  std::__cxx11::string::append((char *)&fileCq);
                                  std::__cxx11::string::operator=
                                            ((string *)&filename,(string *)&fileCq);
                                  if (_fileCq != local_310) {
                                    operator_delete(_fileCq,local_310[0] + 1);
                                  }
                                  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
                                            (&fileCq,filename._M_dataplus._M_p,_S_trunc);
                                  chrono::StreamOUTsparseMatlabFormat(&matrM,local_400);
                                  chrono::StreamOUTsparseMatlabFormat(&matrCq,local_50);
                                  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&fileCq);
                                  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&fileM);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)filename._M_dataplus._M_p != &filename.field_2) {
                                    operator_delete(filename._M_dataplus._M_p,
                                                    filename.field_2._M_allocated_capacity + 1);
                                  }
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::StreamOUT(&matrM,pCVar4);
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::StreamOUT(&matrCq,pCVar4);
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar4,"**** Using ChSolverPSOR  ********** \n\n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<
                                                     (pCVar4,"METRICS: max residual: ");
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<(pCVar4,max_res);
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<
                                                     (pCVar4,"  max LCP error: ");
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<(pCVar4,max_LCPerr);
                                  chrono::ChStreamOutAscii::operator<<(pCVar4,"  \n\n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar4,"vars q_a and q_b -------------------\n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChVariables::Get_qb
                                            ((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
                                  chrono::operator<<(pCVar4,(
                                                  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                                                  *)&fileM);
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChVariables::Get_qb
                                            ((ChVectorRef *)&fileM,(ChVariables *)&mvarB);
                                  pCVar4 = chrono::operator<<(pCVar4,(
                                                  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                                                  *)&fileM);
                                  chrono::ChStreamOutAscii::operator<<(pCVar4,"  \n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar4,"multipliers l_1 and l_2 ------------\n\n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<(pCVar4,local_758);
                                  chrono::ChStreamOutAscii::operator<<(pCVar4," \n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<(pCVar4,local_7f0);
                                  chrono::ChStreamOutAscii::operator<<(pCVar4," \n\n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar4,"constraint residuals c_1 and c_2 ---\n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<(pCVar4,local_760);
                                  chrono::ChStreamOutAscii::operator<<(pCVar4,"  \n");
                                  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar4 = (ChStreamOutAscii *)
                                           chrono::ChStreamOutAscii::operator<<(pCVar4,local_7f8);
                                  chrono::ChStreamOutAscii::operator<<(pCVar4,"  \n\n\n");
                                  chrono::ChVariables::Get_qb
                                            ((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
                                  vVar3.m_value = _fileM;
                                  if (-1 < IVar2) {
                                    pMVar11 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar2;
                                    if (((_fileM & 7U) == 0) &&
                                       (pMVar11 = (Matrix<double,__1,__1,_1,__1,__1> *)
                                                  (ulong)(-((uint)((ulong)_fileM >> 3) & 0x1fffffff)
                                                         & 7), IVar2 <= (long)pMVar11)) {
                                      pMVar11 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar2;
                                    }
                                    uVar5 = IVar2 - (long)pMVar11;
                                    uVar8 = uVar5 + 7;
                                    if (-1 < (long)uVar5) {
                                      uVar8 = uVar5;
                                    }
                                    if (0 < (long)pMVar11) {
                                      memset((void *)_fileM,0,(long)pMVar11 * 8);
                                    }
                                    pIVar9 = (Index *)((long)&(pMVar11->
                                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data + (uVar8 & 0xfffffffffffffff8))
                                    ;
                                    if (7 < (long)uVar5) {
                                      pIVar6 = &(pMVar11->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                ).m_storage.m_rows;
                                      if ((long)pIVar6 < (long)pIVar9) {
                                        pIVar6 = pIVar9;
                                      }
                                      memset((undefined8 *)(vVar3.m_value + (long)pMVar11 * 8),0,
                                             (~(ulong)pMVar11 + (long)pIVar6 & 0xfffffffffffffff8) *
                                             8 + 0x40);
                                    }
                                    if (IVar2 - (long)pIVar9 != 0 && (long)pIVar9 <= IVar2) {
                                      memset((undefined8 *)
                                             (vVar3.m_value + ((long)uVar8 >> 3) * 0x40) +
                                             (long)pMVar11,0,(IVar2 - (long)pIVar9) * 8);
                                    }
                                    chrono::ChVariables::Get_qb
                                              ((ChVectorRef *)&fileM,(ChVariables *)&mvarB);
                                    vVar3.m_value = _fileM;
                                    if (-1 < IVar2) {
                                      pMVar11 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar2;
                                      if (((_fileM & 7U) == 0) &&
                                         (pMVar11 = (Matrix<double,__1,__1,_1,__1,__1> *)
                                                    (ulong)(-((uint)((ulong)_fileM >> 3) &
                                                             0x1fffffff) & 7),
                                         IVar2 <= (long)pMVar11)) {
                                        pMVar11 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar2;
                                      }
                                      uVar5 = IVar2 - (long)pMVar11;
                                      uVar8 = uVar5 + 7;
                                      if (-1 < (long)uVar5) {
                                        uVar8 = uVar5;
                                      }
                                      if (0 < (long)pMVar11) {
                                        memset((void *)_fileM,0,(long)pMVar11 * 8);
                                      }
                                      pIVar9 = (Index *)((long)&(pMVar11->
                                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data + (uVar8 & 0xfffffffffffffff8))
                                      ;
                                      if (7 < (long)uVar5) {
                                        pIVar6 = &(pMVar11->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                        if ((long)pIVar6 < (long)pIVar9) {
                                          pIVar6 = pIVar9;
                                        }
                                        memset((undefined8 *)(vVar3.m_value + (long)pMVar11 * 8),0,
                                               (~(ulong)pMVar11 + (long)pIVar6 & 0xfffffffffffffff8)
                                               * 8 + 0x40);
                                      }
                                      if (IVar2 - (long)pIVar9 != 0 && (long)pIVar9 <= IVar2) {
                                        memset((undefined8 *)
                                               (vVar3.m_value + ((long)uVar8 >> 3) * 0x40) +
                                               (long)pMVar11,0,(IVar2 - (long)pIVar9) * 8);
                                      }
                                      matrCq._vptr_SparseMatrix =
                                           (_func_int **)&PTR_SetElement_001355e8;
                                      free(matrCq.m_outerIndex);
                                      free(matrCq.m_innerNonZeros);
                                      Eigen::internal::CompressedStorage<double,_int>::
                                      ~CompressedStorage(&matrCq.m_data);
                                      matrM._vptr_SparseMatrix =
                                           (_func_int **)&PTR_SetElement_001355e8;
                                      free(matrM.m_outerIndex);
                                      free(matrM.m_innerNonZeros);
                                      Eigen::internal::CompressedStorage<double,_int>::
                                      ~CompressedStorage(&matrM.m_data);
                                      chrono::ChIterativeSolverVI::~ChIterativeSolverVI
                                                ((ChIterativeSolverVI *)&solver);
                                      chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(&mcb);
                                      chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(&mca);
                                      chrono::ChVariablesGeneric::~ChVariablesGeneric(&mvarB);
                                      chrono::ChVariablesGeneric::~ChVariablesGeneric(&mvarA);
                                      chrono::ChSystemDescriptor::~ChSystemDescriptor(&mdescriptor);
                                      return;
                                    }
                                  }
                                  pcVar7 = 
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                                  ;
                                  goto LAB_0010f4cc;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pcVar7 = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, Level = 1]"
          ;
          goto LAB_0010f4ab;
        }
        goto LAB_0010f447;
      }
    }
    pcVar7 = 
    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
    ;
LAB_0010f4ab:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,pcVar7);
  }
LAB_0010f447:
  pcVar7 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_0010f4cc:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar7);
}

Assistant:

void test_1(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with two constraints \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables and constraints, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description starts here

    // create C++ objects representing 'variables':

    ChVariablesGeneric mvarA(3);
    mvarA.GetMass().setIdentity();
    mvarA.GetMass() *= 10;
    mvarA.GetInvMass() = mvarA.GetMass().inverse();
    mvarA.Get_fb()(0) = 1;
    mvarA.Get_fb()(1) = 2;

    ChVariablesGeneric mvarB(3);
    mvarB.GetMass().setIdentity();
    mvarB.GetMass() *= 20;
    mvarB.GetInvMass() = mvarB.GetMass().inverse();

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);

    // create C++ objects representing 'constraints' between variables:

    ChConstraintTwoGeneric mca(&mvarA, &mvarB);
    mca.Set_b_i(-5);
    mca.Get_Cq_a()(0) = 1;
    mca.Get_Cq_a()(1) = 2;
    mca.Get_Cq_a()(2) = -1;
    mca.Get_Cq_b()(0) = 1;
    mca.Get_Cq_b()(1) = -2;
    mca.Get_Cq_b()(2) = 0;

    ChConstraintTwoGeneric mcb(&mvarA, &mvarB);
    mcb.Set_b_i(1);
    mcb.Get_Cq_a()(0) = 0;
    mcb.Get_Cq_a()(1) = 1;
    mcb.Get_Cq_a()(2) = 0;
    mcb.Get_Cq_b()(0) = 0;
    mcb.Get_Cq_b()(1) = -2;
    mcb.Get_Cq_b()(2) = 0;

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Solve the problem with an iterative fixed-point solver, for an
    // approximate (but very fast) solution:
    
    // Create the solver...
    ChSolverPSOR solver;
    solver.SetMaxIterations(1);
    solver.EnableWarmStart(false);
    solver.SetTolerance(0.0);
    solver.SetOmega(0.8);

    // .. pass the constraint and the variables to the solver to solve
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // Ok, now present the result to the user, with some
    // statistical information:
    double max_res, max_LCPerr;
    mdescriptor.ComputeFeasabilityViolation(max_res, max_LCPerr);

    // If needed, dump the full system M and Cq matrices
    // on disk, in Matlab sparse format:
    ChSparseMatrix matrM;
    ChSparseMatrix matrCq;

    mdescriptor.ConvertToMatrixForm(&matrCq, &matrM, 0, 0, 0, 0, false, false);

    try {
        std::string filename = out_dir + "/dump_M_1.dat";
        ChStreamOutAsciiFile fileM(filename.c_str());
        filename = out_dir + "/dump_Cq_1.dat";
        ChStreamOutAsciiFile fileCq(filename.c_str());
        StreamOUTsparseMatlabFormat(matrM, fileM);
        StreamOUTsparseMatlabFormat(matrCq, fileCq);
    } catch (const ChException &myex) {
        GetLog() << "FILE ERROR: " << myex.what();
    }

    StreamOUT(matrM, GetLog());
    StreamOUT(matrCq, GetLog());

    GetLog() << "**** Using ChSolverPSOR  ********** \n\n";
    GetLog() << "METRICS: max residual: " << max_res << "  max LCP error: " << max_LCPerr << "  \n\n";
    GetLog() << "vars q_a and q_b -------------------\n";
    GetLog() << mvarA.Get_qb();
    GetLog() << mvarB.Get_qb() << "  \n";
    GetLog() << "multipliers l_1 and l_2 ------------\n\n";
    GetLog() << mca.Get_l_i() << " \n";
    GetLog() << mcb.Get_l_i() << " \n\n";
    GetLog() << "constraint residuals c_1 and c_2 ---\n";
    GetLog() << mca.Get_c_i() << "  \n";
    GetLog() << mcb.Get_c_i() << "  \n\n\n";

    // reset variables
    mvarA.Get_qb().setZero();
    mvarB.Get_qb().setZero();
}